

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ContainTest.h
# Opt level: O1

void __thiscall
oout::ContainTest::ContainTest<char_const*>(ContainTest *this,string *text,char *subs)

{
  allocator<char> local_59;
  StringText *local_58;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_50;
  shared_ptr<const_oout::Text> local_48;
  string local_38;
  
  local_58 = (StringText *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<oout::StringText,std::allocator<oout::StringText>,std::__cxx11::string_const&>
            (&_Stack_50,&local_58,(allocator<oout::StringText> *)&local_38,text);
  local_48.super___shared_ptr<const_oout::Text,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       &local_58->super_Text;
  local_48.super___shared_ptr<const_oout::Text,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Stack_50._M_pi;
  local_58 = (StringText *)0x0;
  _Stack_50._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,subs,&local_59);
  ContainTest<>(this,&local_48,&local_38);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  if (local_48.super___shared_ptr<const_oout::Text,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_48.super___shared_ptr<const_oout::Text,_(__gnu_cxx::_Lock_policy)2>._M_refcount
               ._M_pi);
  }
  if (_Stack_50._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_50._M_pi);
  }
  return;
}

Assistant:

ContainTest(
		const std::string &text,
		S ... subs
	) : ContainTest(std::make_shared<StringText>(text), subs...)
	{
	}